

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O0

int32_t FastPForLib::Simple8b_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint64_t *output,
                  int32_t outOffset)

{
  uint uVar1;
  uint uVar2;
  long in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint64_t inputVal;
  uint32_t j;
  uint64_t val;
  uint64_t maxVal;
  uint32_t bitLen;
  uint32_t intNum;
  uint32_t code;
  uint64_t repeatCount;
  uint64_t outVal;
  uint32_t remainingCount;
  uint32_t outPos;
  uint32_t inEnd;
  uint32_t inPos;
  uint local_7c;
  ulong in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  ulong local_60;
  uint local_44;
  ulong local_38;
  uint local_28;
  uint local_20;
  
  local_28 = in_R8D;
  local_20 = in_ESI;
  do {
    if (in_ESI + in_EDX <= local_20) {
      return local_28 - in_R8D;
    }
    uVar1 = (in_ESI + in_EDX) - local_20;
    local_38 = 0;
    uVar2 = tryRunLength((uint32_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (uint32_t)(in_stack_ffffffffffffff90 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff90);
    if (uVar2 == 0) {
      for (local_44 = 1; local_44 < 0xf; local_44 = local_44 + 1) {
        local_7c = uVar1;
        if (*(uint *)(Simple8b_Codec_bitLength + (ulong)(0xf - local_44) * 4) < uVar1) {
          local_7c = *(uint *)(Simple8b_Codec_bitLength + (ulong)(0xf - local_44) * 4);
        }
        local_60 = (ulong)local_44 << 0x3c;
        in_stack_ffffffffffffff9c = 0;
        while ((in_stack_ffffffffffffff9c < local_7c &&
               (in_stack_ffffffffffffff90 =
                     (ulong)*(uint *)(in_RDI + (ulong)(local_20 + in_stack_ffffffffffffff9c) * 4),
               in_stack_ffffffffffffff90 <=
               (1L << ((byte)*(undefined4 *)(Simple8b_Codec_bitLength + (ulong)local_44 * 4) & 0x3f)
               ) - 1U))) {
          local_60 = in_stack_ffffffffffffff90 <<
                     ((char)in_stack_ffffffffffffff9c *
                      (byte)*(undefined4 *)(Simple8b_Codec_bitLength + (ulong)local_44 * 4) & 0x3f)
                     | local_60;
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1;
        }
        if (in_stack_ffffffffffffff9c == local_7c) {
          local_38 = local_60;
          local_20 = local_7c + local_20;
          break;
        }
      }
      if (local_44 == 0xf) {
        local_38 = (ulong)*(uint *)(in_RDI + (ulong)local_20 * 4) | 0xf000000000000000;
        local_20 = local_20 + 1;
      }
    }
    else {
      if (0xffffffe < uVar2) {
        uVar2 = 0xfffffff;
      }
      local_38 = (ulong)uVar2 << 0x20 | 0xf000000000000000 |
                 (ulong)*(uint *)(in_RDI + (ulong)local_20 * 4);
      local_20 = uVar2 + local_20;
    }
    *(ulong *)(in_RCX + (ulong)local_28 * 8) = local_38;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint64_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint64_t outVal = 0;

#if defined(_SIMPLE8B_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint64_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (static_cast<uint64_t>(SIMPLE8B_MAXCODE) << SIMPLE8B_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += static_cast<uint32_t>(repeatCount);
      } else
#endif
      {
        // otherwise try all the bit packing possibilities
        uint32_t code = SIMPLE8B_MINCODE;
        for (; code < SIMPLE8B_MAXCODE; code++) {
          uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
          uint32_t bitLen = Simple8b_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint64_t maxVal = (1ULL << bitLen) - 1;
          uint64_t val = static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint64_t inputVal = static_cast<uint64_t>(input[inPos + j]);
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value
        if (code == SIMPLE8B_MAXCODE) {
          outVal = (static_cast<uint64_t>(code) << SIMPLE8B_BITSIZE) |
                   input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }